

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
adios2::profiling::JSONProfiler::AggregateProfilingJSON(JSONProfiler *this,string *rankLog)

{
  unsigned_long *elements;
  char *source;
  long in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  char *in_stack_00000058;
  size_t in_stack_00000060;
  size_t *in_stack_00000068;
  size_t in_stack_00000070;
  char *in_stack_00000078;
  Comm *in_stack_00000080;
  int in_stack_00000090;
  size_t position;
  size_t gatheredSize;
  string footer;
  string header;
  vector<unsigned_long,_std::allocator<unsigned_long>_> rankLogsSizes;
  size_t rankLogSize;
  vector<char,_std::allocator<char>_> *profilingJSON;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  unsigned_long in_stack_fffffffffffffeb0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffeb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffec0;
  vector<char,_std::allocator<char>_> *this_01;
  size_type in_stack_fffffffffffffec8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  Comm *in_stack_fffffffffffffee8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [54];
  allocator<char> local_3a;
  byte local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  undefined8 local_20;
  
  local_20 = std::__cxx11::string::size();
  helper::Comm::GatherValues<unsigned_long>
            (in_stack_fffffffffffffee8,(unsigned_long)in_stack_fffffffffffffee0,
             (int)(in_stack_fffffffffffffed8 >> 0x20));
  local_39 = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (allocator_type *)in_stack_fffffffffffffec0._M_current);
  std::allocator<char>::~allocator(&local_3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"[\n",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"\n]\n",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (*(int *)(in_RSI + 0x78) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffef0 =
         (vector<char,_std::allocator<char>_> *)
         std::
         accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                   (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    in_stack_fffffffffffffee8 = (Comm *)std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    helper::CopyToBuffer<char>
              (in_stack_fffffffffffffef0,(size_t *)in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  this_01 = *(vector<char,_std::allocator<char>_> **)(in_RSI + 0x80);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  this_00 = &local_38;
  elements = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd2585d);
  source = (char *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
  std::vector<char,_std::allocator<char>_>::operator[](in_RDI,0);
  helper::Comm::GathervArrays<char>
            (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
             in_stack_00000060,in_stack_00000058,in_stack_00000090);
  if (*(int *)(in_RSI + 0x78) == 0) {
    std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    helper::CopyToBuffer<char>
              (in_stack_fffffffffffffef0,(size_t *)in_stack_fffffffffffffee8,source,(size_t)elements
              );
  }
  local_39 = 1;
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  if ((local_39 & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::~vector(this_01);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  return in_RDI;
}

Assistant:

std::vector<char> JSONProfiler::AggregateProfilingJSON(const std::string &rankLog) const
{
    // Gather sizes
    const size_t rankLogSize = rankLog.size();
    std::vector<size_t> rankLogsSizes = m_Comm.GatherValues(rankLogSize);

    // Gatherv JSON per rank
    std::vector<char> profilingJSON(3);
    const std::string header("[\n");
    const std::string footer("\n]\n");
    size_t gatheredSize = 0;
    size_t position = 0;

    if (m_RankMPI == 0) // pre-allocate in destination
    {
        gatheredSize = std::accumulate(rankLogsSizes.begin(), rankLogsSizes.end(), size_t(0));

        profilingJSON.resize(gatheredSize + header.size() + footer.size() - 2);
        adios2::helper::CopyToBuffer(profilingJSON, position, header.c_str(), header.size());
    }

    m_Comm.GathervArrays(rankLog.c_str(), rankLog.size(), rankLogsSizes.data(),
                         rankLogsSizes.size(), &profilingJSON[position]);

    if (m_RankMPI == 0) // add footer to close JSON
    {
        position += gatheredSize - 2;
        helper::CopyToBuffer(profilingJSON, position, footer.c_str(), footer.size());
    }

    return profilingJSON;
}